

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int JS_IsArray(JSContext *ctx,JSValue val)

{
  JSValueUnion *pJVar1;
  ulong uVar2;
  JSValueUnion JVar3;
  
  uVar2 = val.tag;
  JVar3 = val.u;
  while( true ) {
    if ((int)uVar2 != -1) {
      return 0;
    }
    if (*(short *)((long)JVar3.ptr + 6) != 0x29) {
      return (uint)(*(short *)((long)JVar3.ptr + 6) == 2);
    }
    pJVar1 = *(JSValueUnion **)((long)JVar3.ptr + 0x30);
    if (pJVar1 == (JSValueUnion *)0x0) {
      return 0;
    }
    if (*(char *)((long)pJVar1 + 0x21) != '\0') break;
    JVar3 = (JSValueUnion)pJVar1->ptr;
    uVar2 = (ulong)(uint)pJVar1[1].int32;
  }
  JS_ThrowTypeErrorRevokedProxy(ctx);
  return -1;
}

Assistant:

int JS_IsArray(JSContext *ctx, JSValueConst val)
{
    JSObject *p;
    if (JS_VALUE_GET_TAG(val) == JS_TAG_OBJECT) {
        p = JS_VALUE_GET_OBJ(val);
        if (unlikely(p->class_id == JS_CLASS_PROXY))
            return js_proxy_isArray(ctx, val);
        else
            return p->class_id == JS_CLASS_ARRAY;
    } else {
        return FALSE;
    }
}